

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomize_test.cxx
# Opt level: O0

void __thiscall string_randomize_test::test_method(string_randomize_test *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d0;
  assertion_result local_b0;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string local_68 [8];
  string output;
  allocator local_31;
  string local_30 [8];
  string input;
  string_randomize_test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"overwrite",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(local_68,local_30);
  local_70._M_current = (char *)std::__cxx11::string::begin();
  local_78 = (char *)std::__cxx11::string::end();
  cryptox::randomize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (local_70,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_78);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/randomize_test.cxx"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_88,0x16,&local_98);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_b0,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,"output != input",0xf);
    boost::unit_test::operator<<(&local_d0,prev,&local_e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/randomize_test.cxx"
               ,0x6f);
    boost::test_tools::tt_detail::report_assertion(&local_b0,&local_d0,&local_f0,0x16,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d0);
    boost::test_tools::assertion_result::~assertion_result(&local_b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(string_randomize_test) {
	const std::string input = "overwrite";
	std::string output = input;

	cryptox::randomize(output.begin(), output.end());
	BOOST_CHECK(output != input);
}